

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::widgets::text::render_attributes(text *this)

{
  form_context *in_RSI;
  
  render_attributes((text *)((long)&(this->super_base_html_input)._vptr_base_html_input +
                            (long)(this->super_base_html_input)._vptr_base_html_input[-0xb]),in_RSI)
  ;
  return;
}

Assistant:

void text::render_attributes(form_context &context)
{
	base_widget::render_attributes(context);

	std::ostream &output = context.out();
	if(size_ >= 0)
		output << "size=\"" << cint(size_) <<"\" ";
	std::pair<int,int> lm=limits();
	if(lm.second >= 0 && validate_charset()) {
		output << "maxlength=\"" << cint(lm.second) << "\" ";
	}
	if(readonly()) {
		output << "readonly=\"readonly\" ";
	}
}